

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_get_Jprojective_coordinates_GFp
              (EC_GROUP *group,EC_POINT *p,BIGNUM *x,BIGNUM *y,BIGNUM *z,BN_CTX *ctx)

{
  undefined4 local_4;
  
  if (*(long *)(*(long *)group + 0x80) == 0) {
    local_4 = 0;
  }
  else if (*(long *)group == *(long *)p) {
    local_4 = (**(code **)(*(long *)group + 0x80))(group,p,x,y,z,ctx);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int EC_POINT_get_Jprojective_coordinates_GFp(const EC_GROUP *group,
                                             const EC_POINT *point, BIGNUM *x,
                                             BIGNUM *y, BIGNUM *z,
                                             BN_CTX *ctx)
{
    if (group->meth->point_get_Jprojective_coordinates_GFp == 0) {
        return 0;
    }
    if (group->meth != point->meth) {
        return 0;
    }
    return group->meth->point_get_Jprojective_coordinates_GFp(group, point, x,
                                                              y, z, ctx);
}